

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O0

Vec_Int_t * Ssc_GiaGetOneSim(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  word *pwVar3;
  bool bVar4;
  word *pRes;
  int nWords;
  int iBit;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vInit;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjSimWords(p);
  pwVar3 = Ssc_GiaGetCareMask(p);
  iVar1 = Ssc_SimFindBit(pwVar3,iVar1);
  if (pwVar3 != (word *)0x0) {
    free(pwVar3);
  }
  if (iVar1 == -1) {
    p_local = (Gia_Man_t *)0x0;
  }
  else {
    p_local = (Gia_Man_t *)Vec_IntAlloc(100);
    nWords = 0;
    while( true ) {
      iVar2 = Vec_IntSize(p->vCis);
      bVar4 = false;
      if (nWords < iVar2) {
        _iBit = Gia_ManCi(p,nWords);
        bVar4 = _iBit != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      pwVar3 = Gia_ObjSimObj(p,_iBit);
      iVar2 = Abc_InfoHasBit((uint *)pwVar3,iVar1);
      Vec_IntPush((Vec_Int_t *)p_local,iVar2);
      nWords = nWords + 1;
    }
  }
  return (Vec_Int_t *)p_local;
}

Assistant:

Vec_Int_t * Ssc_GiaGetOneSim( Gia_Man_t * p )
{
    Vec_Int_t * vInit;
    Gia_Obj_t * pObj;
    int i, iBit, nWords = Gia_ObjSimWords( p );
    word * pRes = Ssc_GiaGetCareMask( p );
    iBit = Ssc_SimFindBit( pRes, nWords );
    ABC_FREE( pRes );
    if ( iBit == -1 )
        return NULL;
    vInit = Vec_IntAlloc( 100 );
    Gia_ManForEachCi( p, pObj, i )
        Vec_IntPush( vInit, Abc_InfoHasBit((unsigned *)Gia_ObjSimObj(p, pObj), iBit) );
    return vInit;
}